

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContactTriangleXYZ::LoadableStateIncrement
          (ChContactTriangleXYZ *this,uint off_x,ChState *x_new,ChState *x,uint off_v,
          ChStateDelta *Dv)

{
  element_type *peVar1;
  
  (*(((this->mnode1).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0x15])();
  peVar1 = (this->mnode2).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0x15])
            (peVar1,(ulong)(off_x + 3),x_new,x,(ulong)(off_v + 3),Dv);
  peVar1 = (this->mnode3).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[0x15])
            (peVar1,(ulong)(off_x + 6),x_new,x,(ulong)(off_v + 6),Dv);
  return;
}

Assistant:

void ChContactTriangleXYZ::LoadableStateIncrement(const unsigned int off_x,
                                                  ChState& x_new,
                                                  const ChState& x,
                                                  const unsigned int off_v,
                                                  const ChStateDelta& Dv) {
    mnode1->NodeIntStateIncrement(off_x, x_new, x, off_v, Dv);
    mnode2->NodeIntStateIncrement(off_x + 3, x_new, x, off_v + 3, Dv);
    mnode3->NodeIntStateIncrement(off_x + 6, x_new, x, off_v + 6, Dv);
}